

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O3

ParseResult * Cmd::parseline(ParseResult *__return_storage_ptr__,string *line)

{
  pointer pcVar1;
  char *in_RCX;
  string_view cmdline;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  trim(line);
  if ((Cmd *)line->_M_string_length == (Cmd *)0x0) {
    (__return_storage_ptr__->argv).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->argv).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->argv).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->line)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->line).field_2;
    (__return_storage_ptr__->line)._M_string_length = 0;
    (__return_storage_ptr__->line).field_2._M_local_buf[0] = '\0';
  }
  else {
    cmdline._M_str = in_RCX;
    cmdline._M_len = (size_t)(line->_M_dataplus)._M_p;
    parseCommand_abi_cxx11_(&local_30,(Cmd *)line->_M_string_length,cmdline);
    if (local_30.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_30.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->argv).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->argv).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->argv).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->line)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->line).field_2;
      (__return_storage_ptr__->line)._M_string_length = 0;
      (__return_storage_ptr__->line).field_2._M_local_buf[0] = '\0';
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->argv,&local_30);
      (__return_storage_ptr__->line)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->line).field_2;
      pcVar1 = (line->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->line,pcVar1,pcVar1 + line->_M_string_length);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParseResult parseline(std::string line) {

		trim(line);

		if (line.empty()) {
			return {};
		}

		auto argv = parseCommand(line);
		if(argv.empty()) {
			return {};
		}

		return ParseResult{argv, line};
	}